

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmUVStreambuf.h
# Opt level: O3

void __thiscall
cmBasicUVStreambuf<char,_std::char_traits<char>_>::~cmBasicUVStreambuf
          (cmBasicUVStreambuf<char,_std::char_traits<char>_> *this)

{
  ~cmBasicUVStreambuf(this);
  operator_delete(this,0x78);
  return;
}

Assistant:

cmBasicUVStreambuf<CharT, Traits>::~cmBasicUVStreambuf()
{
  this->close();
}